

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_batchcompute_post_job.cc
# Opt level: O0

int __thiscall
aliyun::BatchCompute::PostJob
          (BatchCompute *this,BatchComputePostJobResponseType *response,
          BatchComputeErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  AliRoaRequest *pAVar4;
  ulong uVar5;
  Value *pVVar6;
  bool local_3c2;
  allocator<char> local_3c1;
  string local_3c0;
  byte local_39a;
  allocator<char> local_399;
  string local_398;
  byte local_372;
  allocator<char> local_371;
  string local_370;
  byte local_34a;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  undefined1 local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  AliRoaRequest *local_238;
  AliRoaRequest *req_rpc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 local_1d0 [8];
  string url;
  undefined1 local_1a8 [8];
  string secheme;
  Reader reader;
  undefined1 local_68 [8];
  Value val;
  int local_48;
  bool parse_success;
  int ret;
  int status_code;
  string str_response;
  BatchComputeErrorInfo *error_info_local;
  BatchComputePostJobResponseType *response_local;
  BatchCompute *this_local;
  
  str_response.field_2._8_8_ = error_info;
  std::__cxx11::string::string((string *)&ret);
  val.comments_._7_1_ = 0;
  Json::Value::Value((Value *)local_68,nullValue);
  Json::Reader::Reader((Reader *)((long)&secheme.field_2 + 8));
  pcVar3 = "http";
  if ((this->use_tls_ & 1U) != 0) {
    pcVar3 = "https";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,pcVar3,(allocator<char> *)(url.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(url.field_2._M_local_buf + 0xf));
  std::operator+(&local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 "://");
  std::operator+(&local_1f0,&local_210,this->host_);
  get_format_string_abi_cxx11_((string *)&req_rpc,"/jobs");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                 &local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&req_rpc);
  std::__cxx11::string::~string((string *)&req_rpc);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  pAVar4 = (AliRoaRequest *)operator_new(0x2c8);
  local_2d1 = 1;
  pcVar3 = this->version_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,pcVar3,&local_259);
  pcVar3 = this->appid_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,pcVar3,&local_281);
  pcVar3 = this->secret_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,pcVar3,&local_2a9);
  std::__cxx11::string::string((string *)&local_2d0,(string *)local_1d0);
  AliRoaRequest::AliRoaRequest(pAVar4,&local_258,&local_280,&local_2a8,&local_2d0);
  local_2d1 = 0;
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  local_238 = pAVar4;
  if ((((this->use_tls_ & 1U) == 0) && (this->proxy_host_ != (char *)0x0)) &&
     (*this->proxy_host_ != '\0')) {
    pcVar3 = this->proxy_host_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,pcVar3,&local_2f9);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)pAVar4,&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator(&local_2f9);
  }
  pAVar4 = local_238;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"POST",&local_321);
  AliHttpRequest::setRequestMethod(&pAVar4->super_AliHttpRequest,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator(&local_321);
  iVar2 = (**(local_238->super_AliHttpRequest)._vptr_AliHttpRequest)();
  if (iVar2 == 0) {
    local_48 = AliHttpRequest::WaitResponseHeaderComplete(&local_238->super_AliHttpRequest);
    AliHttpRequest::ReadResponseBody(&local_238->super_AliHttpRequest,(string *)&ret);
    if ((0 < local_48) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
      val.comments_._7_1_ =
           Json::Reader::parse((Reader *)((long)&secheme.field_2 + 8),(string *)&ret,
                               (Value *)local_68,true);
    }
    if ((val.comments_._7_1_ & 1) == 0) {
      if (str_response.field_2._8_8_ != 0) {
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x20),"parse response failed");
      }
      local_48 = -1;
    }
    else {
      if ((local_48 != 200) && (str_response.field_2._8_8_ != 0)) {
        local_34a = 0;
        bVar1 = Json::Value::isMember((Value *)local_68,"RequestId");
        if (bVar1) {
          pVVar6 = Json::Value::operator[]((Value *)local_68,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_348,pVVar6);
        }
        else {
          std::allocator<char>::allocator();
          local_34a = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_348,anon_var_dwarf_ac4ec + 9,&local_349);
        }
        std::__cxx11::string::operator=((string *)str_response.field_2._8_8_,(string *)&local_348);
        std::__cxx11::string::~string((string *)&local_348);
        if ((local_34a & 1) != 0) {
          std::allocator<char>::~allocator(&local_349);
        }
        local_372 = 0;
        bVar1 = Json::Value::isMember((Value *)local_68,"Code");
        if (bVar1) {
          pVVar6 = Json::Value::operator[]((Value *)local_68,"Code");
          Json::Value::asString_abi_cxx11_(&local_370,pVVar6);
        }
        else {
          std::allocator<char>::allocator();
          local_372 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_370,anon_var_dwarf_ac4ec + 9,&local_371);
        }
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x20),(string *)&local_370);
        std::__cxx11::string::~string((string *)&local_370);
        if ((local_372 & 1) != 0) {
          std::allocator<char>::~allocator(&local_371);
        }
        local_39a = 0;
        bVar1 = Json::Value::isMember((Value *)local_68,"HostId");
        if (bVar1) {
          pVVar6 = Json::Value::operator[]((Value *)local_68,"HostId");
          Json::Value::asString_abi_cxx11_(&local_398,pVVar6);
        }
        else {
          std::allocator<char>::allocator();
          local_39a = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_398,anon_var_dwarf_ac4ec + 9,&local_399);
        }
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x60),(string *)&local_398);
        std::__cxx11::string::~string((string *)&local_398);
        if ((local_39a & 1) != 0) {
          std::allocator<char>::~allocator(&local_399);
        }
        local_3c2 = Json::Value::isMember((Value *)local_68,"Message");
        if (local_3c2) {
          pVVar6 = Json::Value::operator[]((Value *)local_68,"Message");
          Json::Value::asString_abi_cxx11_(&local_3c0,pVVar6);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3c0,anon_var_dwarf_ac4ec + 9,&local_3c1);
        }
        local_3c2 = !local_3c2;
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x40),(string *)&local_3c0);
        std::__cxx11::string::~string((string *)&local_3c0);
        if (local_3c2) {
          std::allocator<char>::~allocator(&local_3c1);
        }
      }
      if ((local_48 == 200) && (response != (BatchComputePostJobResponseType *)0x0)) {
        anon_unknown.dwarf_40c59::Json2Type((Value *)local_68,response);
      }
    }
  }
  else {
    if (str_response.field_2._8_8_ != 0) {
      std::__cxx11::string::operator=
                ((string *)(str_response.field_2._8_8_ + 0x20),"connect to host failed");
    }
    local_48 = -1;
  }
  pAVar4 = local_238;
  if (local_238 != (AliRoaRequest *)0x0) {
    AliRoaRequest::~AliRoaRequest(local_238);
    operator_delete(pAVar4,0x2c8);
  }
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::string::~string((string *)local_1a8);
  Json::Reader::~Reader((Reader *)((long)&secheme.field_2 + 8));
  Json::Value::~Value((Value *)local_68);
  std::__cxx11::string::~string((string *)&ret);
  return local_48;
}

Assistant:

int BatchCompute::PostJob(BatchComputePostJobResponseType* response,
                      BatchComputeErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  Json::Value val;
  Json::Reader reader;
  std::string secheme = this->use_tls_ ? "https" : "http";
  std::string url = secheme  + "://" + host_ + get_format_string("/jobs");
  AliRoaRequest* req_rpc = new AliRoaRequest(version_,
                         appid_,
                         secret_,
                         url);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  req_rpc->setRequestMethod("POST");
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}